

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib579.c
# Opt level: O0

int progress_callback(void *clientp,double dltotal,double dlnow,double ultotal,double ulnow)

{
  FILE *__stream;
  FILE *moo;
  double ulnow_local;
  double ultotal_local;
  double dlnow_local;
  double dltotal_local;
  void *clientp_local;
  
  if ((progress_callback::prev_ultotal != (int)ultotal) ||
     (progress_callback::prev_ulnow != (int)ulnow)) {
    __stream = fopen64(libtest_arg2,"ab");
    if (__stream != (FILE *)0x0) {
      curl_mfprintf(__stream,"Progress callback called with UL %d out of %d\n",(int)ulnow,
                    (int)ultotal);
      fclose(__stream);
    }
    progress_callback::prev_ulnow = (int)ulnow;
    progress_callback::prev_ultotal = (int)ultotal;
  }
  return 0;
}

Assistant:

static int progress_callback(void *clientp, double dltotal, double dlnow,
                             double ultotal, double ulnow)
{
  FILE *moo;
  static int prev_ultotal = -1;
  static int prev_ulnow = -1;
  (void)clientp; /* UNUSED */
  (void)dltotal; /* UNUSED */
  (void)dlnow; /* UNUSED */

  /* to avoid depending on timing, which will cause this progress function to
     get called a different number of times depending on circumstances, we
     only log these lines if the numbers are different from the previous
     invoke */
  if((prev_ultotal != (int)ultotal) ||
     (prev_ulnow != (int)ulnow)) {

    moo = fopen(libtest_arg2, "ab");
    if(moo) {
      fprintf(moo, "Progress callback called with UL %d out of %d\n",
              (int)ulnow, (int)ultotal);
      fclose(moo);
    }
    prev_ulnow = (int) ulnow;
    prev_ultotal = (int) ultotal;
  }
  return 0;
}